

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

edata_t * duckdb_je_arena_extent_alloc_large
                    (tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero)

{
  _Bool _Var1;
  tsdn_t *tsdn_00;
  void *__s;
  size_t __n;
  ulong in_RDX;
  arena_t *in_RDI;
  byte in_R8B;
  uint uVar2;
  _Bool *in_stack_00000010;
  size_t usize_1;
  void *addr;
  edata_t *edata;
  _Bool zero_override;
  _Bool guarded;
  size_t esize;
  szind_t szind;
  _Bool deferred_work_generated;
  szind_t ret;
  undefined4 in_stack_ffffffffffffff5c;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 zero_00;
  arena_t *in_stack_ffffffffffffff88;
  tsdn_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  byte bVar3;
  edata_t *local_28;
  
  if (0x1000 < in_RDX) {
    sz_size2index_compute((size_t)in_stack_ffffffffffffff88);
  }
  tsdn_00 = (tsdn_t *)(in_RDX + duckdb_je_sz_large_pad);
  duckdb_je_arena_get_ehooks((arena_t *)0x24b5158);
  _Var1 = san_large_extent_decide_guard
                    ((tsdn_t *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                     (ehooks_t *)in_RDI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  zero_00 = (in_R8B & 1) != 0 && duckdb_je_opt_calloc_madvise_threshold <= in_RDX;
  uVar2 = (uint)(byte)zero_00;
  bVar3 = zero_00;
  local_28 = duckdb_je_pa_alloc(tsdn_00,(pa_shard_t *)
                                        CONCAT17(_Var1,CONCAT16(zero_00,in_stack_ffffffffffffffa0)),
                                in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                                SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0),
                                (szind_t)in_stack_ffffffffffffff88,(_Bool)zero_00,
                                (_Bool)in_stack_ffffffffffffff86,in_stack_00000010);
  if (local_28 == (edata_t *)0x0) {
    local_28 = (edata_t *)0x0;
  }
  else {
    arena_large_malloc_stats_update
              ((tsdn_t *)
               CONCAT17(zero_00,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
               in_RDI,in_stack_ffffffffffffff70);
    if (duckdb_je_sz_large_pad != 0) {
      arena_cache_oblivious_randomize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (edata_t *)
                 CONCAT17(zero_00,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                 (size_t)in_RDI);
    }
    if ((((in_R8B & 1) != 0) && ((bVar3 & 1) == 0)) && (_Var1 = edata_zeroed_get(local_28), !_Var1))
    {
      __s = edata_addr_get(local_28);
      __n = edata_usize_get((edata_t *)CONCAT44(in_stack_ffffffffffffff5c,uVar2));
      memset(__s,0,__n);
    }
  }
  return local_28;
}

Assistant:

edata_t *
arena_extent_alloc_large(tsdn_t *tsdn, arena_t *arena, size_t usize,
    size_t alignment, bool zero) {
	bool deferred_work_generated = false;
	szind_t szind = sz_size2index(usize);
	size_t esize = usize + sz_large_pad;

	bool guarded = san_large_extent_decide_guard(tsdn,
	    arena_get_ehooks(arena), esize, alignment);

	/*
	 * - if usize >= opt_calloc_madvise_threshold,
	 *     - pa_alloc(..., zero_override = zero, ...)
	 * - otherwise,
	 *     - pa_alloc(..., zero_override = false, ...)
	 *     - use memset() to zero out memory if zero == true.
	 */
	bool zero_override = zero && (usize >= opt_calloc_madvise_threshold);
	edata_t *edata = pa_alloc(tsdn, &arena->pa_shard, esize, alignment,
	    /* slab */ false, szind, zero_override, guarded,
	    &deferred_work_generated);

	if (edata == NULL) {
		return NULL;
	}

	if (config_stats) {
		arena_large_malloc_stats_update(tsdn, arena, usize);
	}
	if (sz_large_pad != 0) {
		arena_cache_oblivious_randomize(tsdn, arena, edata, alignment);
	}
	/*
	 * This branch should be put after the randomization so that the addr
	 * returned by edata_addr_get() has already be randomized,
	 * if cache_oblivious is enabled.
	 */
	if (zero && !zero_override && !edata_zeroed_get(edata)) {
		void *addr = edata_addr_get(edata);
		size_t usize = edata_usize_get(edata);
		memset(addr, 0, usize);
	}

	return edata;
}